

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::AddPackage
          (DescriptorBuilder *this,string_view name,Message *proto,FileDescriptor *file,
          bool toplevel)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  long lVar1;
  void *pvVar2;
  Symbol symbol;
  pointer pcVar3;
  size_t sVar4;
  size_t sVar5;
  Tables *this_00;
  ulong uVar6;
  size_type __n;
  string_view element_name;
  string_view full_name;
  string_view name_00;
  string_view name_01;
  string_view full_name_00;
  Symbol existing_symbol;
  FileDescriptor *other_file;
  code *pcVar8;
  size_t local_80;
  pointer local_78;
  Symbol local_70;
  size_t **local_68;
  code *pcStack_60;
  size_t **local_58;
  code *pcStack_50;
  size_t *local_48;
  FileDescriptor **local_40;
  FileDescriptor *local_38;
  ulong uVar7;
  
  pcVar3 = name._M_str;
  sVar4 = name._M_len;
  local_80 = sVar4;
  local_78 = pcVar3;
  if ((sVar4 == 0) ||
     (pvVar2 = memchr(pcVar3,0,sVar4), (long)pvVar2 - (long)pcVar3 == -1 || pvVar2 == (void *)0x0))
  {
    local_70 = DescriptorPool::Tables::FindSymbol(this->tables_,name);
    if ((local_70.ptr_)->symbol_type_ == '\0') {
      this_00 = this->tables_;
      if (toplevel) {
        pcVar3 = (file->package_->_M_dataplus)._M_p;
        sVar4 = file->package_->_M_string_length;
        (file->super_SymbolBase).symbol_type_ = '\t';
        symbol.ptr_ = &file->super_SymbolBase;
      }
      else {
        symbol.ptr_ = &DescriptorPool::Tables::Allocate<google::protobuf::Symbol::Subpackage>
                                 (this_00)->super_SymbolBase;
        ((Subpackage *)symbol.ptr_)->name_size = (int)local_80;
        ((Subpackage *)symbol.ptr_)->file = file;
        this_00 = this->tables_;
        (((Subpackage *)symbol.ptr_)->super_SymbolBase).symbol_type_ = '\n';
        pcVar3 = local_78;
        sVar4 = local_80;
      }
      full_name._M_str = pcVar3;
      full_name._M_len = sVar4;
      DescriptorPool::Tables::AddSymbol(this_00,full_name,symbol);
      uVar7 = local_80;
      if (local_80 == 0) {
LAB_002195fc:
        uVar6 = 0xffffffffffffffff;
      }
      else {
        do {
          uVar6 = uVar7 - 1;
          if (uVar7 == 0) goto LAB_002195fc;
          lVar1 = uVar7 - 1;
          uVar7 = uVar6;
        } while (local_78[lVar1] != '.');
      }
      pcVar3 = local_78;
      sVar5 = local_80;
      if (uVar6 != 0xffffffffffffffff) {
        sVar4 = local_80;
        if (uVar6 <= local_80) {
          sVar4 = uVar6;
        }
        name_00._M_str = local_78;
        name_00._M_len = sVar4;
        AddPackage(this,name_00,proto,file,false);
        if (local_80 <= uVar6) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr")
          ;
        }
        pcVar3 = local_78 + uVar6 + 1;
        sVar5 = local_80 - (uVar6 + 1);
      }
      name_01._M_str = pcVar3;
      name_01._M_len = sVar5;
      full_name_00._M_str = local_78;
      full_name_00._M_len = local_80;
      ValidateSymbolName(this,name_01,full_name_00,proto);
      return;
    }
    if ((byte)((local_70.ptr_)->symbol_type_ - 9) < 2) {
      return;
    }
    local_38 = Symbol::GetFile(&local_70);
    local_40 = &local_38;
    local_68 = &local_48;
    pcStack_60 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::AddPackage(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::FileDescriptor*,bool)::__1,std::__cxx11::string>
    ;
    pcVar8 = absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::AddPackage(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::FileDescriptor*,bool)::__1,std::__cxx11::string>
    ;
    pcVar3 = local_78;
    sVar4 = local_80;
  }
  else {
    local_58 = &local_48;
    pcStack_50 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::AddPackage(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::FileDescriptor*,bool)::__0,std::__cxx11::string>
    ;
    pcVar8 = absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::AddPackage(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::FileDescriptor*,bool)::__0,std::__cxx11::string>
    ;
  }
  local_48 = &local_80;
  make_error.invoker_ = pcVar8;
  make_error.ptr_.obj = &local_48;
  element_name._M_str = pcVar3;
  element_name._M_len = sVar4;
  AddError(this,element_name,proto,NAME,make_error);
  return;
}

Assistant:

void DescriptorBuilder::AddPackage(const absl::string_view name,
                                   const Message& proto, FileDescriptor* file,
                                   bool toplevel) {
  if (absl::StrContains(name, '\0')) {
    AddError(name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
      return absl::StrCat("\"", name, "\" contains null character.");
    });
    return;
  }

  Symbol existing_symbol = tables_->FindSymbol(name);
  // It's OK to redefine a package.
  if (existing_symbol.IsNull()) {
    if (toplevel) {
      // It is the toplevel package name, so insert the descriptor directly.
      tables_->AddSymbol(file->package(), Symbol(file));
    } else {
      auto* package = tables_->Allocate<Symbol::Subpackage>();
      // If the name is the package name, then it is already in the arena.
      // If not, copy it there. It came from the call to AddPackage below.
      package->name_size = static_cast<int>(name.size());
      package->file = file;
      tables_->AddSymbol(name, Symbol(package));
    }
    // Also add parent package, if any.
    std::string::size_type dot_pos = name.find_last_of('.');
    if (dot_pos == std::string::npos) {
      // No parents.
      ValidateSymbolName(name, name, proto);
    } else {
      // Has parent.
      AddPackage(name.substr(0, dot_pos), proto, file, false);
      ValidateSymbolName(name.substr(dot_pos + 1), name, proto);
    }
  } else if (!existing_symbol.IsPackage()) {
    // Symbol seems to have been defined in a different file.
    const FileDescriptor* other_file = existing_symbol.GetFile();
    AddError(name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
      return absl::StrCat("\"", name,
                          "\" is already defined (as something other than "
                          "a package) in file \"",
                          (other_file == nullptr ? "null" : other_file->name()),
                          "\".");
    });
  }
}